

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

ER __thiscall slang::ast::ForLoopStatement::evalImpl(ForLoopStatement *this,EvalContext *context)

{
  size_type sVar1;
  pointer ppEVar2;
  __index_type _Var3;
  bool bVar4;
  ER EVar5;
  ER EVar6;
  long lVar7;
  ConstantValue result;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  sVar1 = (this->initializers).size_;
  if (sVar1 != 0) {
    ppEVar2 = (this->initializers).data_;
    lVar7 = 0;
    do {
      Expression::eval((ConstantValue *)&local_58,*(Expression **)((long)ppEVar2 + lVar7),context);
      _Var3 = local_58._M_index;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      if (_Var3 == '\0') {
        return Fail;
      }
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  do {
    if (this->stopExpr != (Expression *)0x0) {
      Expression::eval((ConstantValue *)&local_58,this->stopExpr,context);
      if (local_58._M_index == '\0') {
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        return Fail;
      }
      bVar4 = ConstantValue::isTrue((ConstantValue *)&local_58);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      if (!bVar4) {
        return Success;
      }
    }
    EVar5 = Statement::eval(this->body,context);
    if ((EVar5 != Success) && (EVar5 != Continue)) {
      EVar6 = Success;
      if (EVar5 != Break) {
        EVar6 = EVar5;
      }
      return EVar6;
    }
    sVar1 = (this->steps).size_;
    if (sVar1 != 0) {
      ppEVar2 = (this->steps).data_;
      lVar7 = 0;
      do {
        Expression::eval((ConstantValue *)&local_58,*(Expression **)((long)ppEVar2 + lVar7),context)
        ;
        _Var3 = local_58._M_index;
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        if (_Var3 == '\0') {
          return Fail;
        }
        lVar7 = lVar7 + 8;
      } while (sVar1 << 3 != lVar7);
    }
  } while( true );
}

Assistant:

ER ForLoopStatement::evalImpl(EvalContext& context) const {
    for (auto init : initializers) {
        if (!init->eval(context))
            return ER::Fail;
    }

    while (true) {
        if (stopExpr) {
            auto result = stopExpr->eval(context);
            if (result.bad())
                return ER::Fail;

            if (!result.isTrue())
                break;
        }

        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }

        for (auto step : steps) {
            if (!step->eval(context))
                return ER::Fail;
        }
    }

    return ER::Success;
}